

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_WriteObjectTag(BCWriterState *s,JSValue obj)

{
  JSAtom v;
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  JSAtomKindEnum JVar6;
  uint32_t v_00;
  int iVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  JSValue obj_00;
  
  dbuf_putc(&s->dbuf,'\b');
  lVar2 = *(long *)((long)obj.u.ptr + 0x18);
  v_00 = 0;
  bVar8 = false;
  bVar5 = true;
  do {
    bVar4 = bVar5;
    if (bVar8) {
      dbuf_put_leb128(&s->dbuf,v_00);
    }
    if (*(int *)(lVar2 + 0x28) != 0) {
      lVar10 = 8;
      uVar9 = 0;
      do {
        v = *(JSAtom *)(lVar2 + 0x44 + uVar9 * 8);
        if (((v != 0) &&
            (JVar6 = JS_AtomGetKind((JSContext *)s->ctx->rt,v), JVar6 == JS_ATOM_KIND_STRING)) &&
           (uVar1 = *(uint *)(lVar2 + 0x40 + uVar9 * 8), (uVar1 >> 0x1c & 1) != 0)) {
          if (0x3fffffff < uVar1) {
            JS_ThrowTypeError(s->ctx,"only value properties are supported");
            return -1;
          }
          if (bVar4) {
            v_00 = v_00 + 1;
          }
          else {
            bc_put_atom(s,v);
            lVar3 = *(long *)((long)obj.u.ptr + 0x20);
            obj_00.tag = *(int64_t *)(lVar3 + lVar10);
            obj_00.u.ptr = ((JSValueUnion *)(lVar3 + -8 + lVar10))->ptr;
            iVar7 = JS_WriteObjectRec(s,obj_00);
            if (iVar7 != 0) {
              return -1;
            }
          }
        }
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while (uVar9 < *(uint *)(lVar2 + 0x28));
    }
    bVar8 = true;
    bVar5 = false;
  } while (bVar4);
  return 0;
}

Assistant:

static int JS_WriteObjectTag(BCWriterState *s, JSValueConst obj)
{
    JSObject *p = JS_VALUE_GET_OBJ(obj);
    uint32_t i, prop_count;
    JSShape *sh;
    JSShapeProperty *pr;
    int pass;
    JSAtom atom;

    bc_put_u8(s, BC_TAG_OBJECT);
    prop_count = 0;
    sh = p->shape;
    for(pass = 0; pass < 2; pass++) {
        if (pass == 1)
            bc_put_leb128(s, prop_count);
        for(i = 0, pr = get_shape_prop(sh); i < sh->prop_count; i++, pr++) {
            atom = pr->atom;
            if (atom != JS_ATOM_NULL &&
                JS_AtomIsString(s->ctx, atom) &&
                (pr->flags & JS_PROP_ENUMERABLE)) {
                if (pr->flags & JS_PROP_TMASK) {
                    JS_ThrowTypeError(s->ctx, "only value properties are supported");
                    goto fail;
                }
                if (pass == 0) {
                    prop_count++;
                } else {
                    bc_put_atom(s, atom);
                    if (JS_WriteObjectRec(s, p->prop[i].u.value))
                        goto fail;
                }
            }
        }
    }
    return 0;
 fail:
    return -1;
}